

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O1

mz_bool tdefl_compress_fast(tdefl_compressor *d)

{
  mz_uint8 *pmVar1;
  byte bVar2;
  ushort uVar3;
  ulong uVar4;
  mz_uint16 *pmVar5;
  int iVar6;
  ulong uVar7;
  ulong __n;
  mz_uint mVar8;
  uint uVar9;
  byte *pbVar10;
  long lVar11;
  mz_uint mVar12;
  ushort uVar13;
  uint uVar14;
  mz_uint8 *pmVar15;
  mz_uint mVar16;
  mz_uint8 *pmVar17;
  uint uVar18;
  byte *pbVar19;
  byte *pbVar20;
  uint uVar21;
  uint uVar22;
  long lVar23;
  mz_uint mVar24;
  uint uVar25;
  bool bVar26;
  bool bVar27;
  byte *local_78;
  int local_70;
  uint local_64;
  
  uVar14 = d->m_lookahead_pos;
  mVar12 = d->m_lookahead_size;
  mVar24 = d->m_dict_size;
  mVar16 = d->m_total_lz_bytes;
  mVar8 = d->m_num_flags_left;
  pbVar19 = d->m_pLZ_code_buf;
  local_78 = d->m_pLZ_flags;
  uVar25 = uVar14 & 0x7fff;
  pmVar1 = d->m_dict;
LAB_0014f04c:
  uVar4 = d->m_src_buf_left;
  if ((uVar4 != 0) || ((d->m_flush != TDEFL_NO_FLUSH && (mVar12 != 0)))) {
    uVar7 = uVar4 & 0xffffffff;
    if (0x1000 - mVar12 <= uVar4) {
      uVar7 = (ulong)(0x1000 - mVar12);
    }
    d->m_src_buf_left = uVar4 - uVar7;
    iVar6 = (int)uVar7;
    if (iVar6 != 0) {
      uVar21 = uVar14 + mVar12;
      do {
        uVar21 = uVar21 & 0x7fff;
        uVar4 = (ulong)(0x8000 - uVar21);
        if ((uint)uVar7 <= 0x8000 - uVar21) {
          uVar4 = uVar7;
        }
        memcpy(pmVar1 + uVar21,d->m_pSrc,uVar4);
        uVar18 = (uint)uVar4;
        if (uVar21 < 0x101) {
          __n = (ulong)(0x101 - uVar21);
          if (uVar18 < 0x101 - uVar21) {
            __n = uVar4;
          }
          memcpy(d->m_dict + (ulong)uVar21 + 0x8000,d->m_pSrc,__n);
        }
        d->m_pSrc = d->m_pSrc + uVar4;
        uVar21 = uVar21 + uVar18;
        uVar18 = (uint)uVar7 - uVar18;
        uVar7 = (ulong)uVar18;
      } while (uVar18 != 0);
    }
    mVar12 = iVar6 + mVar12;
    uVar21 = 0x8000 - mVar12;
    if (mVar24 <= 0x8000 - mVar12) {
      uVar21 = mVar24;
    }
    mVar24 = uVar21;
    if ((d->m_flush != TDEFL_NO_FLUSH) || (iVar6 = 3, 0xfff < mVar12)) {
      do {
        if (mVar12 < 4) goto LAB_0014f503;
        uVar4 = (ulong)uVar25;
        uVar21 = *(uint *)(d->m_dict + uVar4);
        uVar18 = uVar21 & 0xfff ^ (uVar21 & 0xffffff) >> 0x11;
        uVar3 = d->m_hash[uVar18];
        uVar13 = (ushort)uVar14;
        d->m_hash[uVar18] = uVar13;
        uVar9 = uVar14 - uVar3;
        uVar18 = uVar9 & 0xffff;
        if ((mVar24 < uVar18) ||
           (uVar7 = (ulong)(uVar3 & 0x7fff),
           (*(uint *)(pmVar1 + uVar7) & 0xffffff) != (uVar21 & 0xffffff))) {
          *pbVar19 = (byte)uVar21;
          *local_78 = *local_78 >> 1;
LAB_0014f2d7:
          uVar4 = (ulong)(uVar21 & 0xff);
          uVar22 = 1;
          pbVar19 = pbVar19 + 1;
        }
        else {
          local_70 = (int)pmVar1 + uVar25;
          pmVar15 = d->m_dict + uVar4 + 0x100;
          pmVar17 = d->m_dict + (ulong)(uVar3 & 0x7fff) + 0x100;
          lVar23 = 0;
          do {
            if (*(short *)(d->m_dict + lVar23 + uVar4 + 2) !=
                *(short *)(d->m_dict + lVar23 + uVar7 + 2)) {
              lVar11 = 0xca;
LAB_0014f3c2:
              pmVar15 = (mz_uint8 *)((long)d->m_max_probes + lVar11 + lVar23 + uVar4 + -0x14);
              pmVar17 = (mz_uint8 *)((long)d->m_max_probes + lVar11 + lVar23 + uVar7 + -0x14);
              bVar27 = false;
              break;
            }
            if (*(short *)(d->m_dict + lVar23 + uVar4 + 4) !=
                *(short *)(d->m_dict + lVar23 + uVar7 + 4)) {
              lVar11 = 0xcc;
              goto LAB_0014f3c2;
            }
            if (*(short *)(d->m_dict + lVar23 + uVar4 + 6) !=
                *(short *)(d->m_dict + lVar23 + uVar7 + 6)) {
              lVar11 = 0xce;
              goto LAB_0014f3c2;
            }
            bVar27 = *(short *)(d->m_dict + lVar23 + uVar4 + 8) ==
                     *(short *)(d->m_dict + lVar23 + uVar7 + 8);
            if (!bVar27) {
              pmVar15 = d->m_dict + lVar23 + uVar4 + 8;
              pmVar17 = d->m_dict + lVar23 + uVar7 + 8;
              break;
            }
            lVar23 = lVar23 + 8;
          } while ((int)lVar23 != 0x100);
          uVar22 = 0x102;
          if (uVar13 == uVar3) {
            uVar22 = 0;
          }
          if (!bVar27) {
            uVar22 = (uint)(*pmVar15 == *pmVar17) | (int)pmVar15 - local_70 & 0xfffffffeU;
          }
          if ((uVar22 < 3) || ((0x1fff < uVar18 && (uVar22 == 3)))) {
            *pbVar19 = (byte)uVar21;
            *local_78 = *local_78 >> 1;
            goto LAB_0014f2d7;
          }
          if ((uVar13 == uVar3) || (0x8000 < (uVar9 & 0xffff))) {
            __assert_fail("(cur_match_len >= TDEFL_MIN_MATCH_LEN) && (cur_match_dist >= 1) && (cur_match_dist <= TDEFL_LZ_DICT_SIZE)"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/miniz/miniz.c"
                          ,0x5f2,"mz_bool tdefl_compress_fast(tdefl_compressor *)");
          }
          if (mVar12 <= uVar22) {
            uVar22 = mVar12;
          }
          uVar18 = uVar18 - 1;
          *pbVar19 = (byte)(uVar22 - 3);
          *(short *)(pbVar19 + 1) = (short)uVar18;
          pbVar19 = pbVar19 + 3;
          *local_78 = *local_78 >> 1 | 0x80;
          pbVar10 = "" + (uVar18 >> 8);
          if (uVar18 < 0x200) {
            pbVar10 = "" + (uVar18 & 0x1ff);
          }
          pmVar5 = d->m_huff_count[1] + *pbVar10;
          *pmVar5 = *pmVar5 + 1;
          uVar4 = (ulong)s_tdefl_len_sym[uVar22 - 3];
        }
        pmVar5 = d->m_huff_count[0] + uVar4;
        *pmVar5 = *pmVar5 + 1;
        bVar27 = mVar8 - 1 == 0;
        if (bVar27) {
          local_78 = pbVar19;
        }
        mVar8 = mVar8 - 1;
        if (bVar27) {
          mVar8 = 8;
        }
        mVar24 = mVar24 + uVar22;
        if (0x7fff < mVar24) {
          mVar24 = 0x8000;
        }
        bVar26 = mVar12 < uVar22;
        mVar12 = mVar12 - uVar22;
        if (bVar26) {
          __assert_fail("lookahead_size >= cur_match_len",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/miniz/miniz.c"
                        ,0x613,"mz_bool tdefl_compress_fast(tdefl_compressor *)");
        }
        pbVar19 = pbVar19 + bVar27;
        mVar16 = mVar16 + uVar22;
        uVar14 = uVar14 + uVar22;
        bVar27 = true;
        if (d->m_lz_code_buf + 0xfff8 < pbVar19) {
          d->m_lookahead_pos = uVar14;
          d->m_lookahead_size = mVar12;
          d->m_dict_size = mVar24;
          d->m_total_lz_bytes = mVar16;
          d->m_pLZ_code_buf = pbVar19;
          d->m_pLZ_flags = local_78;
          d->m_num_flags_left = mVar8;
          uVar21 = tdefl_flush_block(d,0);
          bVar27 = uVar21 == 0;
          if (bVar27) {
            mVar16 = d->m_total_lz_bytes;
            pbVar19 = d->m_pLZ_code_buf;
            local_78 = d->m_pLZ_flags;
            mVar8 = d->m_num_flags_left;
          }
          else {
            local_64 = ~uVar21 >> 0x1f;
          }
        }
        uVar25 = uVar25 + uVar22 & 0x7fff;
      } while (bVar27);
      iVar6 = 1;
    }
    goto LAB_0014f5f4;
  }
  goto LAB_0014f60a;
  while( true ) {
    bVar2 = d->m_dict[uVar25];
    *pbVar19 = bVar2;
    *local_78 = *local_78 >> 1;
    mVar16 = mVar16 + 1;
    pbVar10 = pbVar19 + 1;
    mVar8 = mVar8 - 1;
    pbVar20 = pbVar19 + 2;
    pbVar19 = pbVar10;
    if (mVar8 == 0) {
      mVar8 = 8;
      local_78 = pbVar10;
      pbVar19 = pbVar20;
    }
    pmVar5 = d->m_huff_count[0] + bVar2;
    *pmVar5 = *pmVar5 + 1;
    uVar14 = uVar14 + 1;
    mVar24 = mVar24 + 1;
    if (0x7fff < mVar24) {
      mVar24 = 0x8000;
    }
    bVar27 = true;
    if (d->m_lz_code_buf + 0xfff8 < pbVar19) {
      d->m_lookahead_pos = uVar14;
      d->m_lookahead_size = mVar12;
      d->m_dict_size = mVar24;
      d->m_total_lz_bytes = mVar16;
      d->m_pLZ_code_buf = pbVar19;
      d->m_pLZ_flags = local_78;
      d->m_num_flags_left = mVar8;
      uVar21 = tdefl_flush_block(d,0);
      bVar27 = uVar21 == 0;
      if (bVar27) {
        mVar16 = d->m_total_lz_bytes;
        pbVar19 = d->m_pLZ_code_buf;
        local_78 = d->m_pLZ_flags;
        mVar8 = d->m_num_flags_left;
      }
      else {
        local_64 = ~uVar21 >> 0x1f;
      }
    }
    uVar25 = uVar25 + 1 & 0x7fff;
    if (!bVar27) break;
LAB_0014f503:
    bVar27 = mVar12 == 0;
    mVar12 = mVar12 - 1;
    if (bVar27) {
      iVar6 = 0;
      mVar12 = 0;
      goto LAB_0014f5f4;
    }
  }
  iVar6 = 1;
LAB_0014f5f4:
  if (iVar6 != 0) {
    if (iVar6 == 3) {
LAB_0014f60a:
      d->m_lookahead_pos = uVar14;
      d->m_lookahead_size = mVar12;
      d->m_dict_size = mVar24;
      d->m_total_lz_bytes = mVar16;
      d->m_pLZ_code_buf = pbVar19;
      d->m_pLZ_flags = local_78;
      d->m_num_flags_left = mVar8;
      local_64 = 1;
    }
    return local_64;
  }
  goto LAB_0014f04c;
}

Assistant:

static mz_bool tdefl_compress_fast(tdefl_compressor *d)
{
    /* Faster, minimally featured LZRW1-style match+parse loop with better register utilization. Intended for applications where raw throughput is valued more highly than ratio. */
    mz_uint lookahead_pos = d->m_lookahead_pos, lookahead_size = d->m_lookahead_size, dict_size = d->m_dict_size, total_lz_bytes = d->m_total_lz_bytes, num_flags_left = d->m_num_flags_left;
    mz_uint8 *pLZ_code_buf = d->m_pLZ_code_buf, *pLZ_flags = d->m_pLZ_flags;
    mz_uint cur_pos = lookahead_pos & TDEFL_LZ_DICT_SIZE_MASK;

    while ((d->m_src_buf_left) || ((d->m_flush) && (lookahead_size)))
    {
        const mz_uint TDEFL_COMP_FAST_LOOKAHEAD_SIZE = 4096;
        mz_uint dst_pos = (lookahead_pos + lookahead_size) & TDEFL_LZ_DICT_SIZE_MASK;
        mz_uint num_bytes_to_process = (mz_uint)MZ_MIN(d->m_src_buf_left, TDEFL_COMP_FAST_LOOKAHEAD_SIZE - lookahead_size);
        d->m_src_buf_left -= num_bytes_to_process;
        lookahead_size += num_bytes_to_process;

        while (num_bytes_to_process)
        {
            mz_uint32 n = MZ_MIN(TDEFL_LZ_DICT_SIZE - dst_pos, num_bytes_to_process);
            memcpy(d->m_dict + dst_pos, d->m_pSrc, n);
            if (dst_pos < (TDEFL_MAX_MATCH_LEN - 1))
                memcpy(d->m_dict + TDEFL_LZ_DICT_SIZE + dst_pos, d->m_pSrc, MZ_MIN(n, (TDEFL_MAX_MATCH_LEN - 1) - dst_pos));
            d->m_pSrc += n;
            dst_pos = (dst_pos + n) & TDEFL_LZ_DICT_SIZE_MASK;
            num_bytes_to_process -= n;
        }

        dict_size = MZ_MIN(TDEFL_LZ_DICT_SIZE - lookahead_size, dict_size);
        if ((!d->m_flush) && (lookahead_size < TDEFL_COMP_FAST_LOOKAHEAD_SIZE))
            break;

        while (lookahead_size >= 4)
        {
            mz_uint cur_match_dist, cur_match_len = 1;
            mz_uint8 *pCur_dict = d->m_dict + cur_pos;
            mz_uint first_trigram = (*(const mz_uint32 *)pCur_dict) & 0xFFFFFF;
            mz_uint hash = (first_trigram ^ (first_trigram >> (24 - (TDEFL_LZ_HASH_BITS - 8)))) & TDEFL_LEVEL1_HASH_SIZE_MASK;
            mz_uint probe_pos = d->m_hash[hash];
            d->m_hash[hash] = (mz_uint16)lookahead_pos;

            if (((cur_match_dist = (mz_uint16)(lookahead_pos - probe_pos)) <= dict_size) && ((*(const mz_uint32 *)(d->m_dict + (probe_pos &= TDEFL_LZ_DICT_SIZE_MASK)) & 0xFFFFFF) == first_trigram))
            {
                const mz_uint16 *p = (const mz_uint16 *)pCur_dict;
                const mz_uint16 *q = (const mz_uint16 *)(d->m_dict + probe_pos);
                mz_uint32 probe_len = 32;
                do
                {
                } while ((TDEFL_READ_UNALIGNED_WORD2(++p) == TDEFL_READ_UNALIGNED_WORD2(++q)) && (TDEFL_READ_UNALIGNED_WORD2(++p) == TDEFL_READ_UNALIGNED_WORD2(++q)) &&
                         (TDEFL_READ_UNALIGNED_WORD2(++p) == TDEFL_READ_UNALIGNED_WORD2(++q)) && (TDEFL_READ_UNALIGNED_WORD2(++p) == TDEFL_READ_UNALIGNED_WORD2(++q)) && (--probe_len > 0));
                cur_match_len = ((mz_uint)(p - (const mz_uint16 *)pCur_dict) * 2) + (mz_uint)(*(const mz_uint8 *)p == *(const mz_uint8 *)q);
                if (!probe_len)
                    cur_match_len = cur_match_dist ? TDEFL_MAX_MATCH_LEN : 0;

                if ((cur_match_len < TDEFL_MIN_MATCH_LEN) || ((cur_match_len == TDEFL_MIN_MATCH_LEN) && (cur_match_dist >= 8U * 1024U)))
                {
                    cur_match_len = 1;
                    *pLZ_code_buf++ = (mz_uint8)first_trigram;
                    *pLZ_flags = (mz_uint8)(*pLZ_flags >> 1);
                    d->m_huff_count[0][(mz_uint8)first_trigram]++;
                }
                else
                {
                    mz_uint32 s0, s1;
                    cur_match_len = MZ_MIN(cur_match_len, lookahead_size);

                    MZ_ASSERT((cur_match_len >= TDEFL_MIN_MATCH_LEN) && (cur_match_dist >= 1) && (cur_match_dist <= TDEFL_LZ_DICT_SIZE));

                    cur_match_dist--;

                    pLZ_code_buf[0] = (mz_uint8)(cur_match_len - TDEFL_MIN_MATCH_LEN);
                    *(mz_uint16 *)(&pLZ_code_buf[1]) = (mz_uint16)cur_match_dist;
                    pLZ_code_buf += 3;
                    *pLZ_flags = (mz_uint8)((*pLZ_flags >> 1) | 0x80);

                    s0 = s_tdefl_small_dist_sym[cur_match_dist & 511];
                    s1 = s_tdefl_large_dist_sym[cur_match_dist >> 8];
                    d->m_huff_count[1][(cur_match_dist < 512) ? s0 : s1]++;

                    d->m_huff_count[0][s_tdefl_len_sym[cur_match_len - TDEFL_MIN_MATCH_LEN]]++;
                }
            }
            else
            {
                *pLZ_code_buf++ = (mz_uint8)first_trigram;
                *pLZ_flags = (mz_uint8)(*pLZ_flags >> 1);
                d->m_huff_count[0][(mz_uint8)first_trigram]++;
            }

            if (--num_flags_left == 0)
            {
                num_flags_left = 8;
                pLZ_flags = pLZ_code_buf++;
            }

            total_lz_bytes += cur_match_len;
            lookahead_pos += cur_match_len;
            dict_size = MZ_MIN(dict_size + cur_match_len, (mz_uint)TDEFL_LZ_DICT_SIZE);
            cur_pos = (cur_pos + cur_match_len) & TDEFL_LZ_DICT_SIZE_MASK;
            MZ_ASSERT(lookahead_size >= cur_match_len);
            lookahead_size -= cur_match_len;

            if (pLZ_code_buf > &d->m_lz_code_buf[TDEFL_LZ_CODE_BUF_SIZE - 8])
            {
                int n;
                d->m_lookahead_pos = lookahead_pos;
                d->m_lookahead_size = lookahead_size;
                d->m_dict_size = dict_size;
                d->m_total_lz_bytes = total_lz_bytes;
                d->m_pLZ_code_buf = pLZ_code_buf;
                d->m_pLZ_flags = pLZ_flags;
                d->m_num_flags_left = num_flags_left;
                if ((n = tdefl_flush_block(d, 0)) != 0)
                    return (n < 0) ? MZ_FALSE : MZ_TRUE;
                total_lz_bytes = d->m_total_lz_bytes;
                pLZ_code_buf = d->m_pLZ_code_buf;
                pLZ_flags = d->m_pLZ_flags;
                num_flags_left = d->m_num_flags_left;
            }
        }

        while (lookahead_size)
        {
            mz_uint8 lit = d->m_dict[cur_pos];

            total_lz_bytes++;
            *pLZ_code_buf++ = lit;
            *pLZ_flags = (mz_uint8)(*pLZ_flags >> 1);
            if (--num_flags_left == 0)
            {
                num_flags_left = 8;
                pLZ_flags = pLZ_code_buf++;
            }

            d->m_huff_count[0][lit]++;

            lookahead_pos++;
            dict_size = MZ_MIN(dict_size + 1, (mz_uint)TDEFL_LZ_DICT_SIZE);
            cur_pos = (cur_pos + 1) & TDEFL_LZ_DICT_SIZE_MASK;
            lookahead_size--;

            if (pLZ_code_buf > &d->m_lz_code_buf[TDEFL_LZ_CODE_BUF_SIZE - 8])
            {
                int n;
                d->m_lookahead_pos = lookahead_pos;
                d->m_lookahead_size = lookahead_size;
                d->m_dict_size = dict_size;
                d->m_total_lz_bytes = total_lz_bytes;
                d->m_pLZ_code_buf = pLZ_code_buf;
                d->m_pLZ_flags = pLZ_flags;
                d->m_num_flags_left = num_flags_left;
                if ((n = tdefl_flush_block(d, 0)) != 0)
                    return (n < 0) ? MZ_FALSE : MZ_TRUE;
                total_lz_bytes = d->m_total_lz_bytes;
                pLZ_code_buf = d->m_pLZ_code_buf;
                pLZ_flags = d->m_pLZ_flags;
                num_flags_left = d->m_num_flags_left;
            }
        }
    }

    d->m_lookahead_pos = lookahead_pos;
    d->m_lookahead_size = lookahead_size;
    d->m_dict_size = dict_size;
    d->m_total_lz_bytes = total_lz_bytes;
    d->m_pLZ_code_buf = pLZ_code_buf;
    d->m_pLZ_flags = pLZ_flags;
    d->m_num_flags_left = num_flags_left;
    return MZ_TRUE;
}